

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

int check_spellcraft(CHAR_DATA *ch,int sn)

{
  short sVar1;
  int iVar2;
  int iVar3;
  CClass *this;
  int in_ESI;
  char_data *in_RDI;
  int in_stack_0000000c;
  float bonus;
  int in_stack_000000b4;
  bool in_stack_000000bb;
  int in_stack_000000bc;
  CHAR_DATA *in_stack_000000c0;
  int in_stack_000000dc;
  CHAR_DATA *in_stack_000000e0;
  undefined8 in_stack_ffffffffffffffd8;
  skill_type *psVar4;
  int in_stack_ffffffffffffffe0;
  float local_18;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  iVar2 = get_skill(in_stack_000000e0,in_stack_000000dc);
  iVar3 = number_range(in_stack_ffffffffffffffe0,iVar3);
  local_18 = (float)((iVar2 + -0x32) / 5) - (float)iVar3;
  if (0.0 < local_18) {
    sVar1 = in_RDI->level;
    psVar4 = skill_table + gsn_spellcraft;
    this = char_data::Class(in_RDI);
    iVar2 = CClass::GetIndex(this);
    if (psVar4->skill_level[iVar2] <= sVar1) {
      if (in_ESI == gsn_bash) {
        local_18 = 0.0;
      }
      else {
        iVar2 = get_curr_stat((CHAR_DATA *)CONCAT44(sn,bonus),in_stack_0000000c);
        local_18 = local_18 / ((float)(0x1b - iVar2) * 0.5);
      }
      check_improve(in_stack_000000c0,in_stack_000000bc,in_stack_000000bb,in_stack_000000b4);
      return (int)local_18;
    }
  }
  return 0;
}

Assistant:

int check_spellcraft(CHAR_DATA *ch, int sn)
{
	float bonus;

	bonus = (get_skill(ch, gsn_spellcraft) - 50) / 5;
	bonus -= number_range(0, 5);

	if (bonus <= 0 || ch->level < skill_table[gsn_spellcraft].skill_level[ch->Class()->GetIndex()])
		return 0;

	/*
	 * Can make exemptions for specific spells, as in the nonsense example of
	 * bash-casting below.
	 */

	if (sn == gsn_bash)
		bonus = 0;
	else
		bonus /= 0.5 * (27 - get_curr_stat(ch, STAT_INT));

	check_improve(ch, gsn_spellcraft, true, 8);

	return (int)bonus;
}